

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

void fmt_array(hd_context *ctx,fmt *fmt,pdf_obj *obj)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  pdf_obj *ppVar6;
  int c;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  
  iVar4 = pdf_array_len(ctx,obj);
  iVar5 = (int)extraout_RDX;
  fmt->sep = 0;
  pcVar3 = fmt->buf;
  if (fmt->tight == 0) {
    if ((pcVar3 != (char *)0x0) && (fmt->len < fmt->cap)) {
      pcVar3[fmt->len] = '[';
    }
    fmt->col = fmt->col + 1;
    fmt->last = 0x5b;
    uVar1 = fmt->len;
    iVar2 = fmt->indent;
    fmt->len = uVar1 + 1;
    fmt->indent = iVar2 + 1;
    if (0 < iVar4) {
      iVar2 = 0;
      uVar7 = extraout_RDX;
      do {
        if (fmt->col < 0x3d) {
          fmt_putc((hd_context *)fmt,(fmt *)0x20,(int)uVar7);
        }
        else {
          fmt_putc((hd_context *)fmt,(fmt *)0xa,(int)uVar7);
          uVar7 = extraout_RDX_00;
          for (iVar5 = fmt->indent; iVar5 != 0; iVar5 = iVar5 + -1) {
            fmt_putc((hd_context *)fmt,(fmt *)0x20,(int)uVar7);
            fmt_putc((hd_context *)fmt,(fmt *)0x20,c);
            uVar7 = extraout_RDX_01;
          }
        }
        ppVar6 = pdf_array_get(ctx,obj,iVar2);
        fmt_obj(ctx,fmt,ppVar6);
        iVar5 = (int)extraout_RDX_02;
        iVar2 = iVar2 + 1;
        uVar7 = extraout_RDX_02;
      } while (iVar2 != iVar4);
      iVar2 = fmt->indent + -1;
    }
    fmt->indent = iVar2;
    fmt_putc((hd_context *)fmt,(fmt *)0x20,iVar5);
    iVar4 = fmt->len;
    if ((fmt->buf != (char *)0x0) && (iVar4 < fmt->cap)) {
      fmt->buf[iVar4] = ']';
      iVar4 = fmt->len;
    }
    fmt->col = fmt->col + 1;
    fmt->len = iVar4 + 1;
    fmt->sep = 1;
    fmt->last = 0x5d;
  }
  else {
    if ((pcVar3 != (char *)0x0) && (fmt->len < fmt->cap)) {
      pcVar3[fmt->len] = '[';
    }
    fmt->col = fmt->col + 1;
    iVar5 = fmt->len + 1;
    fmt->len = iVar5;
    fmt->last = 0x5b;
    if (0 < iVar4) {
      iVar5 = 0;
      do {
        ppVar6 = pdf_array_get(ctx,obj,iVar5);
        fmt_obj(ctx,fmt,ppVar6);
        fmt->sep = 1;
        iVar5 = iVar5 + 1;
      } while (iVar4 != iVar5);
      iVar5 = fmt->len;
    }
    fmt->sep = 0;
    if ((fmt->buf != (char *)0x0) && (iVar5 < fmt->cap)) {
      fmt->buf[iVar5] = ']';
      iVar5 = fmt->len;
    }
    fmt->col = fmt->col + 1;
    fmt->len = iVar5 + 1;
    fmt->last = 0x5d;
  }
  return;
}

Assistant:

static void fmt_array(hd_context *ctx, struct fmt *fmt, pdf_obj *obj)
{
    int i, n;

    n = pdf_array_len(ctx, obj);
    if (fmt->tight) {
        fmt_putc(ctx, fmt, '[');
        for (i = 0; i < n; i++) {
            fmt_obj(ctx, fmt, pdf_array_get(ctx, obj, i));
            fmt_sep(ctx, fmt);
        }
        fmt_putc(ctx, fmt, ']');
    }
    else {
        fmt_putc(ctx, fmt, '[');
        fmt->indent ++;
        for (i = 0; i < n; i++) {
            if (fmt->col > 60) {
                fmt_putc(ctx, fmt, '\n');
                fmt_indent(ctx, fmt);
            } else {
                fmt_putc(ctx, fmt, ' ');
            }
            fmt_obj(ctx, fmt, pdf_array_get(ctx, obj, i));
        }
        fmt->indent --;
        fmt_putc(ctx, fmt, ' ');
        fmt_putc(ctx, fmt, ']');
        fmt_sep(ctx, fmt);
    }
}